

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall
Variable_hasInterfaceType_Test::~Variable_hasInterfaceType_Test
          (Variable_hasInterfaceType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, hasInterfaceType)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::NONE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));

    v1->removeInterfaceType();
    EXPECT_FALSE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE));
    EXPECT_TRUE(v1->hasInterfaceType(libcellml::Variable::InterfaceType::NONE));
}